

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int wiz_show_rooms(void)

{
  uint uVar1;
  nh_menuitem *pnVar2;
  int iVar3;
  char local_8c;
  nh_menuitem *_item_;
  int i;
  int rno;
  char row [81];
  int local_1c;
  int y;
  int x;
  menulist menu;
  
  init_menulist((menulist *)&y);
  for (stack0xffffffffffffffe0 = 0; stack0xffffffffffffffe0 < 0x15;
      register0x00000000 = stack0xffffffffffffffe0 + 1) {
    for (local_1c = 0; local_1c < 0x50; local_1c = local_1c + 1) {
      uVar1 = *(uint *)&level->locations[local_1c][stack0xffffffffffffffe0].field_0x6 >> 0x10 & 0x3f
      ;
      if (uVar1 == 0) {
        *(undefined1 *)((long)&i + (long)local_1c) = 0x2e;
      }
      else if (uVar1 == 1) {
        *(undefined1 *)((long)&i + (long)local_1c) = 0x2b;
      }
      else if (uVar1 == 2) {
        *(undefined1 *)((long)&i + (long)local_1c) = 0x2a;
      }
      else {
        iVar3 = (int)(uVar1 - 3) % 0x34;
        local_8c = (char)iVar3;
        if (iVar3 < 0x1a) {
          local_8c = local_8c + 'a';
        }
        else {
          local_8c = local_8c + 'A';
        }
        *(char *)((long)&i + (long)local_1c) = local_8c;
      }
    }
    row[0x48] = '\0';
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _y = (nh_menuitem *)realloc(_y,(long)(int)menu.items * 0x10c);
    }
    pnVar2 = _y + menu.items._4_4_;
    pnVar2->id = 0;
    pnVar2->role = MI_TEXT;
    pnVar2->accel = '\0';
    pnVar2->group_accel = '\0';
    pnVar2->selected = '\0';
    strcpy(pnVar2->caption,(char *)&i);
    menu.items._4_4_ = menu.items._4_4_ + 1;
  }
  display_menu(_y,menu.items._4_4_,(char *)0x0,0,(int *)0x0);
  free(_y);
  return 0;
}

Assistant:

static int wiz_show_rooms(void)
{
	struct menulist menu;
	int x, y;
	char row[COLNO+1];

	init_menulist(&menu);

	for (y = 0; y < ROWNO; y++) {
	    for (x = 0; x < COLNO; x++) {
		int rno = level->locations[x][y].roomno;
		if (rno == NO_ROOM) {
		    row[x] = '.';
		} else if (rno == SHARED) {
		    row[x] = '+';
		} else if (rno == SHARED_PLUS) {
		    row[x] = '*';
		} else {
		    int i = (rno - ROOMOFFSET) % 52;
		    row[x] = (i < 26) ? ('a' + i) : ('A' + i);
		}
	    }
	    row[COLNO] = '\0';
	    add_menutext(&menu, row);
	}
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
	free(menu.items);
	return 0;
}